

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  int iVar1;
  uint uVar2;
  FILE *pFVar3;
  size_t sVar4;
  uchar *__ptr;
  size_t __size;
  
  pFVar3 = fopen(filename,"rb");
  if (pFVar3 == (FILE *)0x0) {
    __size = 0xffffffffffffffff;
  }
  else {
    iVar1 = fseek(pFVar3,0,2);
    __size = 0xffffffffffffffff;
    if (iVar1 == 0) {
      sVar4 = ftell(pFVar3);
      __size = 0xffffffffffffffff;
      if (sVar4 != 0x7fffffffffffffff) {
        __size = sVar4;
      }
    }
    fclose(pFVar3);
  }
  uVar2 = 0x4e;
  if (-1 < (long)__size) {
    *outsize = __size;
    __ptr = (uchar *)malloc(__size);
    *out = __ptr;
    uVar2 = 0x53;
    if (__size == 0 || __ptr != (uchar *)0x0) {
      pFVar3 = fopen(filename,"rb");
      uVar2 = 0x4e;
      if (pFVar3 != (FILE *)0x0) {
        sVar4 = fread(__ptr,1,__size,pFVar3);
        fclose(pFVar3);
        uVar2 = 0x4e;
        if (sVar4 == __size) {
          uVar2 = 0;
        }
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename) {
  long size = lodepng_filesize(filename);
  if(size < 0) return 78;
  *outsize = (size_t)size;

  *out = (unsigned char*)lodepng_malloc((size_t)size);
  if(!(*out) && size > 0) return 83; /*the above malloc failed*/

  return lodepng_buffer_file(*out, (size_t)size, filename);
}